

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall
icu_63::CharString::appendPathPart(CharString *this,StringPiece s,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char *pcVar3;
  StringPiece s_00;
  char c;
  UErrorCode *errorCode_local;
  CharString *this_local;
  StringPiece s_local;
  
  this_local = (CharString *)s.ptr_;
  s_local.ptr_._0_4_ = s.length_;
  UVar1 = U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (iVar2 = StringPiece::length((StringPiece *)&this_local), iVar2 != 0)) {
    if (0 < this->len) {
      pcVar3 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)(this->len + -1));
      if ((*pcVar3 != '/') && (*pcVar3 != '/')) {
        append(this,'/',errorCode);
      }
    }
    s_00.length_ = (int32_t)s_local.ptr_;
    s_00.ptr_ = (char *)this_local;
    s_00._12_4_ = 0;
    append(this,s_00,errorCode);
  }
  return this;
}

Assistant:

CharString &CharString::appendPathPart(StringPiece s, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(s.length()==0) {
        return *this;
    }
    char c;
    if(len>0 && (c=buffer[len-1])!=U_FILE_SEP_CHAR && c!=U_FILE_ALT_SEP_CHAR) {
        append(U_FILE_SEP_CHAR, errorCode);
    }
    append(s, errorCode);
    return *this;
}